

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O2

void * tc_malloc_skip_new_handler(size_t size)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ThreadCache *this;
  sbyte sVar4;
  size_t in_RSI;
  ThreadCachePtr TVar5;
  void *local_30;
  void *rv;
  
  TVar5 = tcmalloc::ThreadCachePtr::Grab();
  this = TVar5.ptr_;
  if (size < 0x401) {
    sVar4 = 3;
    iVar3 = 7;
  }
  else {
    if (0x40000 < size) {
      local_30 = anon_unknown.dwarf_136dd::do_malloc_pages((ThreadCache *)size,in_RSI);
      goto LAB_0010edab;
    }
    sVar4 = 7;
    iVar3 = 0x3c7f;
  }
  bVar1 = (&tcmalloc::Static::sizemap_)[(uint)(iVar3 + (int)size) >> sVar4];
  iVar3 = this->list_[bVar1].size_;
  bVar2 = tcmalloc::ThreadCache::FreeList::TryPop(this->list_ + bVar1,&local_30);
  if (bVar2) {
    this->size_ = this->size_ - iVar3;
  }
  else {
    local_30 = tcmalloc::ThreadCache::FetchFromCentralCache
                         (this,(uint)bVar1,iVar3,anon_unknown.dwarf_136dd::nop_oom_handler);
  }
LAB_0010edab:
  tcmalloc::InvokeNewHook(local_30,size);
  return local_30;
}

Assistant:

PERFTOOLS_DLL_DECL void* tc_malloc_skip_new_handler(size_t size)  PERFTOOLS_NOTHROW {
  void* result = do_malloc(size);
  tcmalloc::InvokeNewHook(result, size);
  return result;
}